

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow.cpp
# Opt level: O0

bool PermittedDifficultyTransition
               (Params *params,int64_t height,uint32_t old_nbits,uint32_t new_nbits)

{
  long lVar1;
  bool bVar2;
  int64_t iVar3;
  uint256 *a;
  base_uint<256U> *pbVar4;
  int in_ECX;
  int in_EDX;
  base_uint<256U> *in_RSI;
  arith_uint256 *in_RDI;
  long in_FS_OFFSET;
  int64_t largest_timespan;
  int64_t smallest_timespan;
  arith_uint256 minimum_new_target;
  arith_uint256 smallest_difficulty_target;
  arith_uint256 maximum_new_target;
  arith_uint256 largest_difficulty_target;
  arith_uint256 observed_new_target;
  arith_uint256 pow_limit;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  uint32_t nCompact;
  bool local_109;
  base_uint<256U> *in_stack_ffffffffffffff00;
  base_uint<256U> *in_stack_ffffffffffffff08;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[7].super_base_uint<256U>.pn[6] & 1) != 0) {
    local_109 = true;
    goto LAB_0051ca93;
  }
  pbVar4 = in_RSI;
  iVar3 = Consensus::Params::DifficultyAdjustmentInterval
                    ((Params *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  nCompact = (uint32_t)((ulong)pbVar4 >> 0x20);
  if ((long)in_RSI % iVar3 == 0) {
    a = (uint256 *)(*(long *)(in_RDI[8].super_base_uint<256U>.pn + 2) / 4);
    pbVar4 = (base_uint<256U> *)(*(long *)(in_RDI[8].super_base_uint<256U>.pn + 2) << 2);
    UintToArith256(a);
    arith_uint256::arith_uint256
              ((arith_uint256 *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    arith_uint256::SetCompact(in_RDI,nCompact,(bool *)CONCAT44(in_EDX,in_ECX),(bool *)a);
    arith_uint256::arith_uint256
              ((arith_uint256 *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    arith_uint256::SetCompact(in_RDI,nCompact,(bool *)CONCAT44(in_EDX,in_ECX),(bool *)a);
    base_uint<256U>::operator*=
              ((base_uint<256U> *)CONCAT44(in_EDX,in_ECX),(uint32_t)((ulong)a >> 0x20));
    base_uint<256U>::base_uint(pbVar4,(uint64_t)in_RSI);
    base_uint<256U>::operator/=(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    bVar2 = operator>(pbVar4,in_RSI);
    if (bVar2) {
      arith_uint256::operator=((arith_uint256 *)pbVar4,(arith_uint256 *)in_RSI);
    }
    arith_uint256::arith_uint256
              ((arith_uint256 *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    arith_uint256::GetCompact((arith_uint256 *)CONCAT44(in_EDX,in_ECX),SUB81((ulong)a >> 0x38,0));
    arith_uint256::SetCompact(in_RDI,nCompact,(bool *)CONCAT44(in_EDX,in_ECX),(bool *)a);
    bVar2 = operator<(pbVar4,in_RSI);
    if (bVar2) {
      local_109 = false;
      goto LAB_0051ca93;
    }
    arith_uint256::arith_uint256
              ((arith_uint256 *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    arith_uint256::SetCompact(in_RDI,nCompact,(bool *)CONCAT44(in_EDX,in_ECX),(bool *)a);
    base_uint<256U>::operator*=
              ((base_uint<256U> *)CONCAT44(in_EDX,in_ECX),(uint32_t)((ulong)a >> 0x20));
    base_uint<256U>::base_uint(pbVar4,(uint64_t)in_RSI);
    base_uint<256U>::operator/=(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    bVar2 = operator>(pbVar4,in_RSI);
    if (bVar2) {
      arith_uint256::operator=((arith_uint256 *)pbVar4,(arith_uint256 *)in_RSI);
    }
    arith_uint256::arith_uint256
              ((arith_uint256 *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    arith_uint256::GetCompact((arith_uint256 *)CONCAT44(in_EDX,in_ECX),SUB81((ulong)a >> 0x38,0));
    arith_uint256::SetCompact(in_RDI,nCompact,(bool *)CONCAT44(in_EDX,in_ECX),(bool *)a);
    bVar2 = operator>(pbVar4,in_RSI);
    if (bVar2) {
      local_109 = false;
      goto LAB_0051ca93;
    }
  }
  else if (in_EDX != in_ECX) {
    local_109 = false;
    goto LAB_0051ca93;
  }
  local_109 = true;
LAB_0051ca93:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_109;
}

Assistant:

bool PermittedDifficultyTransition(const Consensus::Params& params, int64_t height, uint32_t old_nbits, uint32_t new_nbits)
{
    if (params.fPowAllowMinDifficultyBlocks) return true;

    if (height % params.DifficultyAdjustmentInterval() == 0) {
        int64_t smallest_timespan = params.nPowTargetTimespan/4;
        int64_t largest_timespan = params.nPowTargetTimespan*4;

        const arith_uint256 pow_limit = UintToArith256(params.powLimit);
        arith_uint256 observed_new_target;
        observed_new_target.SetCompact(new_nbits);

        // Calculate the largest difficulty value possible:
        arith_uint256 largest_difficulty_target;
        largest_difficulty_target.SetCompact(old_nbits);
        largest_difficulty_target *= largest_timespan;
        largest_difficulty_target /= params.nPowTargetTimespan;

        if (largest_difficulty_target > pow_limit) {
            largest_difficulty_target = pow_limit;
        }

        // Round and then compare this new calculated value to what is
        // observed.
        arith_uint256 maximum_new_target;
        maximum_new_target.SetCompact(largest_difficulty_target.GetCompact());
        if (maximum_new_target < observed_new_target) return false;

        // Calculate the smallest difficulty value possible:
        arith_uint256 smallest_difficulty_target;
        smallest_difficulty_target.SetCompact(old_nbits);
        smallest_difficulty_target *= smallest_timespan;
        smallest_difficulty_target /= params.nPowTargetTimespan;

        if (smallest_difficulty_target > pow_limit) {
            smallest_difficulty_target = pow_limit;
        }

        // Round and then compare this new calculated value to what is
        // observed.
        arith_uint256 minimum_new_target;
        minimum_new_target.SetCompact(smallest_difficulty_target.GetCompact());
        if (minimum_new_target > observed_new_target) return false;
    } else if (old_nbits != new_nbits) {
        return false;
    }
    return true;
}